

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# int_helper.c
# Opt level: O0

void helper_vmsummbm_ppc(CPUPPCState_conflict *env,ppc_avr_t *r,ppc_avr_t *a,ppc_avr_t *b,
                        ppc_avr_t *c)

{
  uint local_7c;
  int iStack_78;
  int i;
  int32_t prod [16];
  ppc_avr_t *c_local;
  ppc_avr_t *b_local;
  ppc_avr_t *a_local;
  ppc_avr_t *r_local;
  CPUPPCState_conflict *env_local;
  
  for (local_7c = 0; local_7c < 0x10; local_7c = local_7c + 1) {
    (&iStack_78)[(int)local_7c] = (int)a->s8[(int)local_7c] * (uint)b->u8[(int)local_7c];
  }
  for (local_7c = 3; -1 < (int)local_7c; local_7c = local_7c + -1) {
    r->u32[(int)local_7c] =
         c->u32[(int)local_7c] + (&iStack_78)[(int)(local_7c << 2)] +
         (&iStack_78)[(int)(local_7c * 4 + 1)] + (&iStack_78)[(int)(local_7c * 4 + 2)] +
         (&iStack_78)[(int)(local_7c * 4 + 3)];
  }
  return;
}

Assistant:

void helper_vmsummbm(CPUPPCState *env, ppc_avr_t *r, ppc_avr_t *a,
                     ppc_avr_t *b, ppc_avr_t *c)
{
    int32_t prod[16];
    int i;

    for (i = 0; i < ARRAY_SIZE(r->s8); i++) {
        prod[i] = (int32_t)a->s8[i] * b->u8[i];
    }

    VECTOR_FOR_INORDER_I(i, s32) {
        r->s32[i] = c->s32[i] + prod[4 * i] + prod[4 * i + 1] +
            prod[4 * i + 2] + prod[4 * i + 3];
    }
}